

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestReader.cpp
# Opt level: O2

void __thiscall OpenMD::RestReader::parseDumpLine(RestReader *this,string *line)

{
  char cVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  StuntDouble *propName;
  ObjectRestraint *this_00;
  ulong uVar5;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>_> restData;
  shared_ptr<OpenMD::GenericData> data;
  Vector3d pos;
  Quat4d q;
  Vector3d ji;
  string type;
  Vector<double,_3U> local_100;
  Vector<double,_3U> local_e8;
  StringTokenizer tokenizer;
  RectMatrix<double,_3U,_3U> local_78;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ji," ;\t\n\r",(allocator<char> *)&type);
  StringTokenizer::StringTokenizer(&tokenizer,line,(string *)&ji);
  std::__cxx11::string::~string((string *)&ji);
  iVar4 = StringTokenizer::countTokens(&tokenizer);
  if (iVar4 < 2) {
    snprintf(painCave.errMsg,2000,"RestReader Error: Not enough Tokens.\n%s\n");
    painCave.isFatal = 1;
    simError();
  }
  iVar4 = StringTokenizer::nextTokenAsInt(&tokenizer);
  propName = SimInfo::getIOIndexToIntegrableObject(this->info_,iVar4);
  if (propName != (StuntDouble *)0x0) {
    StringTokenizer::nextToken_abi_cxx11_(&type,&tokenizer);
    Vector<double,_3U>::Vector(&pos.super_Vector<double,_3U>);
    Vector<double,_4U>::Vector(&q.super_Vector<double,_4U>);
    uVar3 = (uint)type._M_string_length;
    if ((int)(uint)type._M_string_length < 1) {
      uVar3 = 0;
    }
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      cVar1 = type._M_dataplus._M_p[uVar5];
      switch(cVar1) {
      case 'p':
        pos.super_Vector<double,_3U>.data_[0] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        pos.super_Vector<double,_3U>.data_[1] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        pos.super_Vector<double,_3U>.data_[2] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        break;
      case 'q':
        if (propName->objType_ - otDAtom < 2) {
          q.super_Vector<double,_4U>.data_[0] = StringTokenizer::nextTokenAsDouble(&tokenizer);
          q.super_Vector<double,_4U>.data_[1] = StringTokenizer::nextTokenAsDouble(&tokenizer);
          q.super_Vector<double,_4U>.data_[2] = StringTokenizer::nextTokenAsDouble(&tokenizer);
          q.super_Vector<double,_4U>.data_[3] = StringTokenizer::nextTokenAsDouble(&tokenizer);
          dVar2 = Vector<double,_4U>::length(&q.super_Vector<double,_4U>);
          if (dVar2 < 1e-06) {
            memcpy(&painCave,
                   "RestReader Error: initial quaternion error (q0^2 + q1^2 + q2^2 + q3^2) ~ 0\n",
                   0x4c);
            painCave.isFatal = 1;
            simError();
          }
          Vector<double,_4U>::normalize(&q.super_Vector<double,_4U>);
        }
        break;
      case 'r':
      case 's':
      case 'u':
switchD_00203b5f_caseD_72:
        snprintf(painCave.errMsg,2000,"RestReader Error: %s is an unrecognized type\n");
        painCave.isFatal = 1;
        simError();
        break;
      case 't':
        Vector<double,_3U>::Vector((Vector<double,_3U> *)&ji);
        ji.super_Vector<double,_3U>.data_[0] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        ji.super_Vector<double,_3U>.data_[1] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        StringTokenizer::nextTokenAsDouble(&tokenizer);
        break;
      case 'v':
        Vector<double,_3U>::Vector((Vector<double,_3U> *)&ji);
        ji.super_Vector<double,_3U>.data_[0] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        ji.super_Vector<double,_3U>.data_[1] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        StringTokenizer::nextTokenAsDouble(&tokenizer);
        break;
      default:
        if (cVar1 == 'f') {
          Vector<double,_3U>::Vector((Vector<double,_3U> *)&ji);
          ji.super_Vector<double,_3U>.data_[0] = StringTokenizer::nextTokenAsDouble(&tokenizer);
          ji.super_Vector<double,_3U>.data_[1] = StringTokenizer::nextTokenAsDouble(&tokenizer);
          StringTokenizer::nextTokenAsDouble(&tokenizer);
        }
        else {
          if (cVar1 != 'j') goto switchD_00203b5f_caseD_72;
          Vector<double,_3U>::Vector((Vector<double,_3U> *)&ji);
          if (propName->objType_ - otDAtom < 2) {
            ji.super_Vector<double,_3U>.data_[0] = StringTokenizer::nextTokenAsDouble(&tokenizer);
            ji.super_Vector<double,_3U>.data_[1] = StringTokenizer::nextTokenAsDouble(&tokenizer);
            StringTokenizer::nextTokenAsDouble(&tokenizer);
          }
        }
      }
      Vector<double,_3U>::operator=
                (&(this->all_pos_).
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar4].super_Vector<double,_3U>,
                 &pos.super_Vector<double,_3U>);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ji,"Restraint",(allocator<char> *)&restData);
      StuntDouble::getPropertyByName((StuntDouble *)&data,(string *)propName);
      std::__cxx11::string::~string((string *)&ji);
      if (data.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::Restraint*>,OpenMD::GenericData>
                  ((shared_ptr<OpenMD::GenericData> *)&restData);
        if (restData.
            super___shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != (element_type *)0x0) {
          if (((restData.
                super___shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->data_ == (Restraint *)0x0) ||
             (this_00 = (ObjectRestraint *)
                        __dynamic_cast((restData.
                                        super___shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->data_,&Restraint::typeinfo,
                                       &ObjectRestraint::typeinfo,0),
             this_00 == (ObjectRestraint *)0x0)) {
            builtin_strncpy(painCave.errMsg + 0x10,"traintData to ObjectRestraint\n",0x1f);
            builtin_strncpy(painCave.errMsg,"Can not cast Res",0x10);
            painCave.isFatal = 1;
            painCave.severity = 1;
            simError();
          }
          else if (propName->objType_ - otDAtom < 2) {
            Vector<double,_3U>::Vector(&local_e8,&pos.super_Vector<double,_3U>);
            Quaternion<double>::toRotationMatrix3((SquareMatrix<double,_3> *)&ji,&q);
            RectMatrix<double,_3U,_3U>::operator=(&local_78,(RectMatrix<double,_3U,_3U> *)&ji);
            ObjectRestraint::setReferenceStructure
                      (this_00,(Vector3d *)&local_e8,(RotMat3x3d *)&local_78);
          }
          else {
            Vector<double,_3U>::Vector(&local_100,&pos.super_Vector<double,_3U>);
            Vector<double,_3U>::operator=(&(this_00->refPos_).super_Vector<double,_3U>,&local_100);
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&restData.
                    super___shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&data.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::__cxx11::string::~string((string *)&type);
  }
  StringTokenizer::~StringTokenizer(&tokenizer);
  return;
}

Assistant:

void RestReader::parseDumpLine(const std::string& line) {
    StringTokenizer tokenizer(line);
    int nTokens;

    nTokens = tokenizer.countTokens();

    if (nTokens < 2) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RestReader Error: Not enough Tokens.\n%s\n", line.c_str());
      painCave.isFatal = 1;
      simError();
    }

    int index = tokenizer.nextTokenAsInt();

    StuntDouble* sd = info_->getIOIndexToIntegrableObject(index);

    if (sd == NULL) { return; }

    std::string type = tokenizer.nextToken();
    int size         = type.size();

    Vector3d pos;
    Quat4d q;

    for (int i = 0; i < size; ++i) {
      switch (type[i]) {
      case 'p': {
        pos[0] = tokenizer.nextTokenAsDouble();
        pos[1] = tokenizer.nextTokenAsDouble();
        pos[2] = tokenizer.nextTokenAsDouble();
        break;
      }
      case 'v': {
        Vector3d vel;
        vel[0] = tokenizer.nextTokenAsDouble();
        vel[1] = tokenizer.nextTokenAsDouble();
        vel[2] = tokenizer.nextTokenAsDouble();
        break;
      }

      case 'q': {
        if (sd->isDirectional()) {
          q[0] = tokenizer.nextTokenAsDouble();
          q[1] = tokenizer.nextTokenAsDouble();
          q[2] = tokenizer.nextTokenAsDouble();
          q[3] = tokenizer.nextTokenAsDouble();

          RealType qlen = q.length();
          if (qlen < OpenMD::epsilon) {  // check quaternion is not equal to 0

            snprintf(
                painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                "RestReader Error: initial quaternion error (q0^2 + q1^2 + "
                "q2^2 + "
                "q3^2) ~ 0\n");
            painCave.isFatal = 1;
            simError();
          }

          q.normalize();
        }
        break;
      }
      case 'j': {
        Vector3d ji;
        if (sd->isDirectional()) {
          ji[0] = tokenizer.nextTokenAsDouble();
          ji[1] = tokenizer.nextTokenAsDouble();
          ji[2] = tokenizer.nextTokenAsDouble();
        }
        break;
      }
      case 'f': {
        Vector3d force;
        force[0] = tokenizer.nextTokenAsDouble();
        force[1] = tokenizer.nextTokenAsDouble();
        force[2] = tokenizer.nextTokenAsDouble();
        break;
      }
      case 't': {
        Vector3d torque;
        torque[0] = tokenizer.nextTokenAsDouble();
        torque[1] = tokenizer.nextTokenAsDouble();
        torque[2] = tokenizer.nextTokenAsDouble();
        break;
      }
      default: {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "RestReader Error: %s is an unrecognized type\n",
                 type.c_str());
        painCave.isFatal = 1;
        simError();
        break;
      }
      }
      // keep the position in case we need it for a molecular restraint:

      all_pos_[index] = pos;

      // is this io restrained?
      std::shared_ptr<GenericData> data = sd->getPropertyByName("Restraint");

      if (data != nullptr) {
        // make sure we can reinterpret the generic data as restraint data:
        std::shared_ptr<RestraintData> restData =
            std::dynamic_pointer_cast<RestraintData>(data);
        if (restData != nullptr) {
          // make sure we can reinterpet the restraint data as a pointer to
          // an ObjectRestraint:
          ObjectRestraint* oRest =
              dynamic_cast<ObjectRestraint*>(restData->getData());
          if (oRest == NULL) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "Can not cast RestraintData to ObjectRestraint\n");
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          } else {
            if (sd->isDirectional()) {
              oRest->setReferenceStructure(pos, q.toRotationMatrix3());
            } else {
              oRest->setReferenceStructure(pos);
            }
          }
        }
      }
    }
  }